

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

void __thiscall
ps::Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
Publisher(Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *this,topic_ptr_t<std::__cxx11::basic_string<char>_*> *topic)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Publisher = (_func_int **)&PTR___cxa_pure_virtual_0010cd10;
  Publisher<std::__cxx11::string*>::get_counter()::counter =
       Publisher<std::__cxx11::string*>::get_counter()::counter + 1;
  this->id = Publisher<std::__cxx11::string*>::get_counter()::counter;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_reverse)._M_t._M_impl.super__Rb_tree_header;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_signals)._M_t._M_impl.super__Rb_tree_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::push_back(&this->m_topics,topic);
  Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::attach
            ((topic->
             super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr,this);
  return;
}

Assistant:

Publisher(const topic_ptr_t<T>& topic)
		: id{get_counter()}
		{
			m_topics.push_back(topic);
			topic->attach(this);
		}